

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cpp
# Opt level: O3

string * (anonymous_namespace)::input_name_abi_cxx11_(void)

{
  uint uVar1;
  undefined4 extraout_EAX;
  uint extraout_var;
  undefined4 extraout_var_00;
  undefined8 *in_RDI;
  
  uVar1 = pstore::command_line::option::get_num_occurrences((option *)json_source_abi_cxx11_);
  *in_RDI = in_RDI + 2;
  if (uVar1 != 0) {
    std::__cxx11::string::_M_construct<char*>();
    return (string *)CONCAT44(extraout_var_00,extraout_EAX);
  }
  *(undefined1 *)((long)in_RDI + 0x14) = 0x6e;
  *(undefined4 *)(in_RDI + 2) = 0x69647473;
  in_RDI[1] = 5;
  *(undefined1 *)((long)in_RDI + 0x15) = 0;
  return (string *)((ulong)extraout_var << 0x20);
}

Assistant:

std::string input_name () { return is_file_input () ? json_source.get () : "stdin"s; }